

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O0

Vec_Bit_t * Acec_MapMajOuts(Gia_Man_t *p,Vec_Int_t *vAdds)

{
  int iVar1;
  Vec_Bit_t *p_00;
  undefined4 local_24;
  int i;
  Vec_Bit_t *vMap;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_BitStart(iVar1);
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vAdds);
    if (iVar1 <= local_24 * 6) break;
    iVar1 = Vec_IntEntry(vAdds,local_24 * 6 + 4);
    Vec_BitWriteEntry(p_00,iVar1,1);
    local_24 = local_24 + 1;
  }
  return p_00;
}

Assistant:

Vec_Bit_t * Acec_MapMajOuts( Gia_Man_t * p, Vec_Int_t * vAdds )
{
    Vec_Bit_t * vMap = Vec_BitStart( Gia_ManObjNum(p) ); int i;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
        Vec_BitWriteEntry( vMap, Vec_IntEntry(vAdds, 6*i+4), 1 );
    return vMap;
}